

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_pack(lua_State *L)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  lua_Number lVar5;
  char *s_2;
  size_t len_2;
  char *s_1;
  size_t len_1;
  char *s;
  size_t len;
  char *buff_2;
  double f_2;
  char *buff_1;
  lua_Number f_1;
  char *buff;
  ulong uStack_480;
  float f;
  lua_Integer n_1;
  lua_Integer lim;
  lua_Integer n;
  int local_460;
  KOption opt;
  int ntoalign;
  int size;
  size_t totalsize;
  char *pcStack_448;
  int arg;
  char *fmt;
  Header h;
  luaL_Buffer b;
  lua_State *L_local;
  
  pcStack_448 = luaL_checklstring(L,1,(size_t *)0x0);
  totalsize._4_4_ = 1;
  _ntoalign = (char *)0x0;
  initheader(L,(Header *)&fmt);
  lua_pushnil(L);
  luaL_buffinit(L,(luaL_Buffer *)&h.islittle);
  do {
    if (*pcStack_448 == '\0') {
      luaL_pushresult((luaL_Buffer *)&h.islittle);
      return 1;
    }
    n._4_4_ = getdetails((Header *)&fmt,(size_t)_ntoalign,&stack0xfffffffffffffbb8,(int *)&opt,
                         &local_460);
    _ntoalign = _ntoalign + (int)(local_460 + opt);
    while (iVar3 = local_460 + -1, 0 < local_460) {
      local_460 = iVar3;
      if (b.b <= b.size) {
        luaL_prepbuffsize((luaL_Buffer *)&h.islittle,1);
      }
      *(undefined1 *)(h._8_8_ + b.size) = 0;
      b.size = b.size + 1;
    }
    totalsize._4_4_ = totalsize._4_4_ + 1;
    local_460 = iVar3;
    switch(n._4_4_) {
    case Kint:
      local_460 = iVar3;
      lim = luaL_checkinteger(L,totalsize._4_4_);
      if (((int)opt < 8) && (n_1 = 1L << ((char)(opt << 3) - 1U & 0x3f), lim < -n_1 || n_1 <= lim))
      {
        luaL_argerror(L,totalsize._4_4_,"integer overflow");
      }
      packint((luaL_Buffer *)&h.islittle,lim,(int)h.L,opt,(uint)(lim < 0));
      break;
    case Kuint:
      local_460 = iVar3;
      uStack_480 = luaL_checkinteger(L,totalsize._4_4_);
      if (((int)opt < 8) && ((ulong)(1L << ((byte)(opt << 3) & 0x3f)) <= uStack_480)) {
        luaL_argerror(L,totalsize._4_4_,"unsigned overflow");
      }
      packint((luaL_Buffer *)&h.islittle,uStack_480,(int)h.L,opt,0);
      break;
    case Kfloat:
      local_460 = iVar3;
      lVar5 = luaL_checknumber(L,totalsize._4_4_);
      buff._4_4_ = (float)lVar5;
      f_1 = (lua_Number)luaL_prepbuffsize((luaL_Buffer *)&h.islittle,4);
      copywithendian((char *)f_1,(char *)((long)&buff + 4),4,(int)h.L);
      b.size = (long)(int)opt + b.size;
      break;
    case Knumber:
      local_460 = iVar3;
      buff_1 = (char *)luaL_checknumber(L,totalsize._4_4_);
      f_2 = (double)luaL_prepbuffsize((luaL_Buffer *)&h.islittle,8);
      copywithendian((char *)f_2,(char *)&buff_1,8,(int)h.L);
      b.size = (long)(int)opt + b.size;
      break;
    case Kdouble:
      local_460 = iVar3;
      buff_2 = (char *)luaL_checknumber(L,totalsize._4_4_);
      len = (size_t)luaL_prepbuffsize((luaL_Buffer *)&h.islittle,8);
      copywithendian((char *)len,(char *)&buff_2,8,(int)h.L);
      b.size = (long)(int)opt + b.size;
      break;
    case Kchar:
      local_460 = iVar3;
      len_1 = (size_t)luaL_checklstring(L,totalsize._4_4_,(size_t *)&s);
      if ((char *)(long)(int)opt < s) {
        luaL_argerror(L,totalsize._4_4_,"string longer than given size");
      }
      luaL_addlstring((luaL_Buffer *)&h.islittle,(char *)len_1,(size_t)s);
      while (pcVar1 = s + 1, bVar4 = s < (char *)(long)(int)opt, s = pcVar1, bVar4) {
        if (b.b <= b.size) {
          luaL_prepbuffsize((luaL_Buffer *)&h.islittle,1);
        }
        *(undefined1 *)(h._8_8_ + b.size) = 0;
        b.size = b.size + 1;
      }
      break;
    case Kstring:
      local_460 = iVar3;
      len_2 = (size_t)luaL_checklstring(L,totalsize._4_4_,(size_t *)&s_1);
      bVar4 = true;
      if ((int)opt < 8) {
        bVar4 = s_1 < (char *)(1L << ((byte)(opt << 3) & 0x3f));
      }
      if (!bVar4) {
        luaL_argerror(L,totalsize._4_4_,"string length does not fit in given size");
      }
      packint((luaL_Buffer *)&h.islittle,(lua_Unsigned)s_1,(int)h.L,opt,0);
      luaL_addlstring((luaL_Buffer *)&h.islittle,(char *)len_2,(size_t)s_1);
      _ntoalign = s_1 + (long)_ntoalign;
      break;
    case Kzstr:
      local_460 = iVar3;
      pcVar1 = luaL_checklstring(L,totalsize._4_4_,(size_t *)&s_2);
      pcVar2 = (char *)strlen(pcVar1);
      if (pcVar2 != s_2) {
        luaL_argerror(L,totalsize._4_4_,"string contains zeros");
      }
      luaL_addlstring((luaL_Buffer *)&h.islittle,pcVar1,(size_t)s_2);
      if (b.b <= b.size) {
        luaL_prepbuffsize((luaL_Buffer *)&h.islittle,1);
      }
      *(undefined1 *)(h._8_8_ + b.size) = 0;
      _ntoalign = s_2 + 1 + (long)_ntoalign;
      b.size = b.size + 1;
      break;
    case Kpadding:
      local_460 = iVar3;
      if (b.b <= b.size) {
        luaL_prepbuffsize((luaL_Buffer *)&h.islittle,1);
      }
      *(undefined1 *)(h._8_8_ + b.size) = 0;
      b.size = b.size + 1;
    case Kpaddalign:
    case Knop:
      totalsize._4_4_ = totalsize._4_4_ + -1;
    }
  } while( true );
}

Assistant:

static int str_pack (lua_State *L) {
  luaL_Buffer b;
  Header h;
  const char *fmt = luaL_checkstring(L, 1);  /* format string */
  int arg = 1;  /* current argument to pack */
  size_t totalsize = 0;  /* accumulate total size of result */
  initheader(L, &h);
  lua_pushnil(L);  /* mark to separate arguments from string buffer */
  luaL_buffinit(L, &b);
  while (*fmt != '\0') {
    int size, ntoalign;
    KOption opt = getdetails(&h, totalsize, &fmt, &size, &ntoalign);
    totalsize += ntoalign + size;
    while (ntoalign-- > 0)
     luaL_addchar(&b, LUAL_PACKPADBYTE);  /* fill alignment */
    arg++;
    switch (opt) {
      case Kint: {  /* signed integers */
        lua_Integer n = luaL_checkinteger(L, arg);
        if (size < SZINT) {  /* need overflow check? */
          lua_Integer lim = (lua_Integer)1 << ((size * NB) - 1);
          luaL_argcheck(L, -lim <= n && n < lim, arg, "integer overflow");
        }
        packint(&b, (lua_Unsigned)n, h.islittle, size, (n < 0));
        break;
      }
      case Kuint: {  /* unsigned integers */
        lua_Integer n = luaL_checkinteger(L, arg);
        if (size < SZINT)  /* need overflow check? */
          luaL_argcheck(L, (lua_Unsigned)n < ((lua_Unsigned)1 << (size * NB)),
                           arg, "unsigned overflow");
        packint(&b, (lua_Unsigned)n, h.islittle, size, 0);
        break;
      }
      case Kfloat: {  /* C float */
        float f = (float)luaL_checknumber(L, arg);  /* get argument */
        char *buff = luaL_prepbuffsize(&b, sizeof(f));
        /* move 'f' to final result, correcting endianness if needed */
        copywithendian(buff, (char *)&f, sizeof(f), h.islittle);
        luaL_addsize(&b, size);
        break;
      }
      case Knumber: {  /* Lua float */
        lua_Number f = luaL_checknumber(L, arg);  /* get argument */
        char *buff = luaL_prepbuffsize(&b, sizeof(f));
        /* move 'f' to final result, correcting endianness if needed */
        copywithendian(buff, (char *)&f, sizeof(f), h.islittle);
        luaL_addsize(&b, size);
        break;
      }
      case Kdouble: {  /* C double */
        double f = (double)luaL_checknumber(L, arg);  /* get argument */
        char *buff = luaL_prepbuffsize(&b, sizeof(f));
        /* move 'f' to final result, correcting endianness if needed */
        copywithendian(buff, (char *)&f, sizeof(f), h.islittle);
        luaL_addsize(&b, size);
        break;
      }
      case Kchar: {  /* fixed-size string */
        size_t len;
        const char *s = luaL_checklstring(L, arg, &len);
        luaL_argcheck(L, len <= (size_t)size, arg,
                         "string longer than given size");
        luaL_addlstring(&b, s, len);  /* add string */
        while (len++ < (size_t)size)  /* pad extra space */
          luaL_addchar(&b, LUAL_PACKPADBYTE);
        break;
      }
      case Kstring: {  /* strings with length count */
        size_t len;
        const char *s = luaL_checklstring(L, arg, &len);
        luaL_argcheck(L, size >= (int)sizeof(size_t) ||
                         len < ((size_t)1 << (size * NB)),
                         arg, "string length does not fit in given size");
        packint(&b, (lua_Unsigned)len, h.islittle, size, 0);  /* pack length */
        luaL_addlstring(&b, s, len);
        totalsize += len;
        break;
      }
      case Kzstr: {  /* zero-terminated string */
        size_t len;
        const char *s = luaL_checklstring(L, arg, &len);
        luaL_argcheck(L, strlen(s) == len, arg, "string contains zeros");
        luaL_addlstring(&b, s, len);
        luaL_addchar(&b, '\0');  /* add zero at the end */
        totalsize += len + 1;
        break;
      }
      case Kpadding: luaL_addchar(&b, LUAL_PACKPADBYTE);  /* FALLTHROUGH */
      case Kpaddalign: case Knop:
        arg--;  /* undo increment */
        break;
    }
  }
  luaL_pushresult(&b);
  return 1;
}